

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O3

shared_ptr<TestBaseType> derived_type_factory(void)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<TestBaseType> sVar2;
  
  puVar1 = (undefined8 *)operator_new(0xc0);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00174cc8;
  puVar1[3] = 0xf0000000a;
  puVar1[4] = (long)puVar1 + 0x1c;
  memset(puVar1 + 5,0,0x98);
  puVar1[2] = &PTR__TestBaseType_00174d40;
  in_RDI->_vptr_TestBaseType = (_func_int **)(puVar1 + 2);
  *(undefined8 **)&in_RDI->val = puVar1;
  sVar2.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<TestBaseType>)
         sVar2.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TestBaseType> derived_type_factory() {
  return std::make_shared<TestDerivedType>();
}